

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O0

void setup_ref_mv_list(AV1_COMMON *cm,MACROBLOCKD *xd,MV_REFERENCE_FRAME ref_frame,
                      uint8_t *refmv_count,CANDIDATE_MV *ref_mv_stack,uint16_t *ref_mv_weight,
                      int_mv *mv_ref_list,int_mv *gm_mv_candidates,int mi_row,int mi_col,
                      int16_t *mode_context)

{
  byte bVar1;
  uint uVar2;
  MACROBLOCKD *in_RCX;
  MV_REFERENCE_FRAME in_DL;
  ushort uVar3;
  MACROBLOCKD *in_RSI;
  AV1_COMMON *in_RDI;
  MACROBLOCKD *in_R8;
  uint16_t *in_R9;
  long in_stack_00000008;
  undefined4 *in_stack_00000010;
  uint in_stack_00000018;
  uint in_stack_00000020;
  long in_stack_00000028;
  int idx_13;
  int idx_12;
  int idx_11;
  MB_MODE_INFO *candidate_3;
  int idx_10;
  MB_MODE_INFO *candidate_2;
  int idx_9;
  int idx_8;
  int idx_7;
  int list_idx_1;
  int list_idx;
  int comp_idx;
  int idx_6;
  int_mv comp_list [2] [2];
  MB_MODE_INFO *candidate_1;
  int idx_5;
  MB_MODE_INFO *candidate;
  int idx_4;
  int ref_diff_count [2];
  int ref_id_count [2];
  int_mv ref_diff [2] [2];
  int_mv ref_id [2] [2];
  int mi_size;
  int mi_height;
  int mi_width;
  uint16_t tmp_ref_mv_weight_1;
  CANDIDATE_MV tmp_mv_1;
  int idx_3;
  int nr_len_1;
  uint16_t tmp_ref_mv_weight;
  CANDIDATE_MV tmp_mv;
  int idx_2;
  int nr_len;
  int len;
  uint8_t ref_match_count;
  int col_offset;
  int row_offset;
  int idx_1;
  uint8_t dummy_newmv_count;
  int blk_col_1;
  int blk_row_1;
  int i;
  int ret;
  int blk_col;
  int blk_row;
  int step_w;
  int step_h;
  int allow_extension;
  int tpl_sample_pos [3] [2];
  int blk_col_end;
  int blk_row_end;
  int hoffset;
  int voffset;
  int is_available;
  int idx;
  uint8_t nearest_refmv_count;
  uint8_t nearest_match;
  uint8_t newmv_count;
  uint8_t row_match_count;
  uint8_t col_match_count;
  int processed_cols;
  int processed_rows;
  int col_adj;
  int row_adj;
  int max_col_offset;
  int max_row_offset;
  TileInfo *tile;
  MV_REFERENCE_FRAME rf [2];
  int has_tr;
  int bs;
  undefined8 in_stack_fffffffffffffda8;
  TileInfo *in_stack_fffffffffffffdb0;
  MACROBLOCKD *xd_00;
  uint16_t *puVar4;
  MV *mv;
  uint local_220;
  int in_stack_fffffffffffffde4;
  undefined2 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdea;
  undefined1 in_stack_fffffffffffffdeb;
  bool bVar5;
  undefined1 in_stack_fffffffffffffdec;
  undefined1 in_stack_fffffffffffffded;
  undefined1 in_stack_fffffffffffffdee;
  undefined1 in_stack_fffffffffffffdef;
  int in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  int in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  uint3 uVar6;
  uint in_stack_fffffffffffffe08;
  uint mi_row_00;
  uint in_stack_fffffffffffffe10;
  uint in_stack_fffffffffffffe14;
  uint in_stack_fffffffffffffe18;
  undefined2 in_stack_fffffffffffffe1c;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined4 in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  MACROBLOCKD *in_stack_fffffffffffffe30;
  MB_MODE_INFO *pMVar9;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  uint8_t *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  int iVar10;
  undefined4 in_stack_fffffffffffffe60;
  int iVar11;
  undefined4 in_stack_fffffffffffffe64;
  int in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  uint8_t *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  uint8_t *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  int iVar12;
  int in_stack_fffffffffffffe98;
  int *in_stack_fffffffffffffea0;
  int_mv local_158 [4];
  int_mv local_148 [4];
  uint local_138;
  uint local_134;
  uint local_130;
  uint16_t local_12a;
  undefined8 local_128;
  uint local_120;
  uint local_11c;
  uint16_t local_116;
  undefined8 local_114;
  uint local_10c;
  uint local_108;
  uint local_104;
  byte local_fd;
  int local_fc;
  int local_f8;
  int local_f4;
  undefined1 local_ed [5];
  uint local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  uint local_cc;
  uint local_c8 [4];
  int local_b8;
  uint local_b4;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  int local_98;
  int local_94;
  byte local_8d;
  char local_8c;
  char local_8b;
  undefined1 local_8a [2];
  int local_88;
  int local_84;
  uint local_80;
  uint local_7c;
  int local_78;
  int local_74;
  TileInfo *local_70;
  MV_REFERENCE_FRAME local_62;
  char local_61;
  int local_60;
  uint local_5c;
  uint16_t *local_58;
  MACROBLOCKD *local_50;
  MACROBLOCKD *local_48;
  MV_REFERENCE_FRAME local_39;
  MACROBLOCKD *local_38;
  AV1_COMMON *local_30;
  uint mi_col_00;
  
  if (in_RSI->height < in_RSI->width) {
    bVar1 = in_RSI->width;
  }
  else {
    bVar1 = in_RSI->height;
  }
  uVar2 = (uint)bVar1;
  local_5c = uVar2;
  local_58 = in_R9;
  local_50 = in_R8;
  local_48 = in_RCX;
  local_39 = in_DL;
  local_38 = in_RSI;
  local_30 = in_RDI;
  local_60 = has_top_right(in_RDI,in_RSI,in_stack_00000018,in_stack_00000020,uVar2);
  local_70 = &local_38->tile;
  local_74 = 0;
  local_78 = 0;
  uVar8 = local_38->height < 2 && (in_stack_00000018 & 1) != 0;
  local_7c = (uint)(byte)uVar8;
  uVar7 = local_38->width < 2 && (in_stack_00000020 & 1) != 0;
  local_80 = (uint)(byte)uVar7;
  local_84 = 0;
  local_88 = 0;
  av1_set_ref_frame(&local_62,local_39);
  *(undefined2 *)(in_stack_00000028 + (long)local_39 * 2) = 0;
  *(undefined1 *)&local_48->mi_row = 0;
  if ((local_38->up_available & 1U) != 0) {
    local_74 = local_7c - 6;
    if (local_38->height < 2) {
      local_74 = local_7c - 4;
    }
    local_74 = find_valid_row_offset
                         (in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                          (int)in_stack_fffffffffffffda8);
  }
  if ((local_38->left_available & 1U) != 0) {
    local_78 = local_80 - 6;
    if (local_38->width < 2) {
      local_78 = local_80 - 4;
    }
    local_78 = find_valid_col_offset
                         (in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                          (int)in_stack_fffffffffffffda8);
  }
  local_8a[1] = '\0';
  local_8a[0] = '\0';
  local_8b = '\0';
  iVar12 = local_74;
  if (local_74 < 1) {
    iVar12 = -local_74;
  }
  if (0 < iVar12) {
    scan_row_mbmi((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                  (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                  (int)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                  (MV_REFERENCE_FRAME *)
                  CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                  (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                  (CANDIDATE_MV *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                  (uint16_t *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                  in_stack_fffffffffffffe78,
                  (uint8_t *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                  in_stack_fffffffffffffe88,
                  (int_mv *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                  in_stack_fffffffffffffe98,in_stack_fffffffffffffea0);
  }
  iVar12 = local_78;
  if (local_78 < 1) {
    iVar12 = -local_78;
  }
  if (0 < iVar12) {
    scan_col_mbmi((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                  in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                  (MV_REFERENCE_FRAME *)CONCAT44(in_stack_fffffffffffffe24,uVar2),
                  CONCAT13(uVar8,CONCAT12(uVar7,in_stack_fffffffffffffe1c)),
                  (CANDIDATE_MV *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                  (uint16_t *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                  (uint8_t *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                  (uint8_t *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                  (uint8_t *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                  (int_mv *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                  (int)in_stack_fffffffffffffe78,
                  (int *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  }
  if (local_60 != 0) {
    scan_blk_mbmi((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                  (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                  in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0,
                  (MV_REFERENCE_FRAME *)
                  CONCAT17(in_stack_fffffffffffffdef,
                           CONCAT16(in_stack_fffffffffffffdee,
                                    CONCAT15(in_stack_fffffffffffffded,
                                             CONCAT14(in_stack_fffffffffffffdec,
                                                      CONCAT13(in_stack_fffffffffffffdeb,
                                                               CONCAT12(in_stack_fffffffffffffdea,
                                                                        in_stack_fffffffffffffde8)))
                                            ))),in_stack_fffffffffffffde4,in_stack_fffffffffffffe10,
                  (CANDIDATE_MV *)
                  CONCAT17(uVar8,CONCAT16(uVar7,CONCAT24(in_stack_fffffffffffffe1c,
                                                         in_stack_fffffffffffffe18))),
                  (uint16_t *)CONCAT44(in_stack_fffffffffffffe24,uVar2),
                  (uint8_t *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                  (uint8_t *)in_stack_fffffffffffffe30,
                  (int_mv *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                  in_stack_fffffffffffffe40);
  }
  local_8c = (local_8a[0] != '\0') + (local_8a[1] != '\0');
  local_8d = (byte)local_48->mi_row;
  for (local_94 = 0; local_94 < (int)(uint)local_8d; local_94 = local_94 + 1) {
    local_58[local_94] = local_58[local_94] + 0x280;
  }
  if (((local_30->features).allow_ref_frame_mvs & 1U) != 0) {
    local_98 = 0;
    if (local_38->height < 2) {
      in_stack_fffffffffffffe18 = 2;
    }
    else {
      in_stack_fffffffffffffe18 = (uint)local_38->height;
    }
    local_9c = in_stack_fffffffffffffe18;
    if (local_38->width < 2) {
      in_stack_fffffffffffffe14 = 2;
    }
    else {
      in_stack_fffffffffffffe14 = (uint)local_38->width;
    }
    local_a0 = in_stack_fffffffffffffe14;
    if (local_38->height < 0x10) {
      in_stack_fffffffffffffe10 = (uint)local_38->height;
    }
    else {
      in_stack_fffffffffffffe10 = 0x10;
    }
    local_a4 = in_stack_fffffffffffffe10;
    if (local_38->width < 0x10) {
      mi_row_00 = (uint)local_38->width;
    }
    else {
      mi_row_00 = 0x10;
    }
    local_a8 = mi_row_00;
    local_c8[0] = in_stack_fffffffffffffe18;
    local_c8[1] = 0xfffffffe;
    local_c8[2] = in_stack_fffffffffffffe18;
    local_c8[3] = in_stack_fffffffffffffe14;
    local_b8 = in_stack_fffffffffffffe18 - 2;
    local_b4 = in_stack_fffffffffffffe14;
    mi_col_00 = in_stack_fffffffffffffe08 & 0xffffff;
    if (((1 < local_38->height) &&
        (mi_col_00 = in_stack_fffffffffffffe08 & 0xffffff, local_38->height < 0x10)) &&
       (mi_col_00 = in_stack_fffffffffffffe08 & 0xffffff, 1 < local_38->width)) {
      mi_col_00 = CONCAT13(local_38->width < 0x10,(int3)in_stack_fffffffffffffe08);
    }
    local_cc = mi_col_00 >> 0x18;
    local_d0 = 2;
    if (0xf < local_38->height) {
      local_d0 = 4;
    }
    local_d4 = 2;
    if (0xf < local_38->width) {
      local_d4 = 4;
    }
    for (local_d8 = 0; local_d8 < (int)local_a4; local_d8 = local_d0 + local_d8) {
      for (local_dc = 0; local_dc < (int)local_a8; local_dc = local_d4 + local_dc) {
        local_e0 = add_tpl_ref_mv((AV1_COMMON *)
                                  CONCAT17(uVar8,CONCAT16(uVar7,CONCAT24(in_stack_fffffffffffffe1c,
                                                                         in_stack_fffffffffffffe18))
                                          ),
                                  (MACROBLOCKD *)
                                  CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                                  mi_row_00,mi_col_00,
                                  (MV_REFERENCE_FRAME)((uint)in_stack_fffffffffffffe04 >> 0x18),
                                  in_stack_fffffffffffffe00,(int)in_stack_fffffffffffffe30,
                                  (int_mv *)
                                  CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                                  in_stack_fffffffffffffe40,
                                  (CANDIDATE_MV *)
                                  CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                                  (uint16_t *)
                                  CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                  (int16_t *)
                                  CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        if ((local_d8 == 0) && (local_dc == 0)) {
          local_98 = local_e0;
        }
      }
    }
    if (local_98 == 0) {
      *(ushort *)(in_stack_00000028 + (long)local_39 * 2) =
           *(ushort *)(in_stack_00000028 + (long)local_39 * 2) | 8;
    }
    local_e4 = 0;
    while( true ) {
      uVar6 = (uint3)(ushort)mi_col_00;
      if (local_e4 < 3) {
        uVar6 = CONCAT12(local_cc != 0,(ushort)mi_col_00);
      }
      mi_col_00 = CONCAT13((char)(mi_col_00 >> 0x18),uVar6);
      if ((char)(uVar6 >> 0x10) == '\0') break;
      local_e8 = local_c8[(long)local_e4 * 2];
      local_ed._1_4_ = local_c8[(long)local_e4 * 2 + 1];
      iVar12 = check_sb_border(in_stack_00000018,in_stack_00000020,local_c8[(long)local_e4 * 2],
                               local_ed._1_4_);
      if (iVar12 != 0) {
        add_tpl_ref_mv((AV1_COMMON *)
                       CONCAT17(uVar8,CONCAT16(uVar7,CONCAT24(in_stack_fffffffffffffe1c,
                                                              in_stack_fffffffffffffe18))),
                       (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                       mi_row_00,mi_col_00,
                       (MV_REFERENCE_FRAME)((uint)in_stack_fffffffffffffe04 >> 0x18),
                       in_stack_fffffffffffffe00,(int)in_stack_fffffffffffffe30,
                       (int_mv *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                       in_stack_fffffffffffffe40,
                       (CANDIDATE_MV *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)
                       ,(uint16_t *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       (int16_t *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      }
      local_e4 = local_e4 + 1;
    }
  }
  local_ed[0] = 0;
  mv = (MV *)local_8a;
  xd_00 = local_50;
  puVar4 = local_58;
  scan_blk_mbmi((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0,
                (MV_REFERENCE_FRAME *)
                CONCAT17(in_stack_fffffffffffffdef,
                         CONCAT16(in_stack_fffffffffffffdee,
                                  CONCAT15(in_stack_fffffffffffffded,
                                           CONCAT14(in_stack_fffffffffffffdec,
                                                    CONCAT13(in_stack_fffffffffffffdeb,
                                                             CONCAT12(in_stack_fffffffffffffdea,
                                                                      in_stack_fffffffffffffde8)))))
                        ),in_stack_fffffffffffffde4,in_stack_fffffffffffffe10,
                (CANDIDATE_MV *)
                CONCAT17(uVar8,CONCAT16(uVar7,CONCAT24(in_stack_fffffffffffffe1c,
                                                       in_stack_fffffffffffffe18))),
                (uint16_t *)CONCAT44(in_stack_fffffffffffffe24,uVar2),
                (uint8_t *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                (uint8_t *)in_stack_fffffffffffffe30,
                (int_mv *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                in_stack_fffffffffffffe40);
  for (local_f4 = 2; local_f4 < 4; local_f4 = local_f4 + 1) {
    local_f8 = local_f4 * -2 + 1 + local_7c;
    local_fc = local_f4 * -2 + 1 + local_80;
    iVar12 = local_f8;
    if (local_f8 < 1) {
      iVar12 = -local_f8;
    }
    iVar10 = local_74;
    if (local_74 < 1) {
      iVar10 = -local_74;
    }
    if (iVar12 <= iVar10) {
      iVar12 = local_f8;
      if (local_f8 < 1) {
        iVar12 = -local_f8;
      }
      if (local_84 < iVar12) {
        puVar4 = (uint16_t *)local_8a;
        mv = (MV *)local_ed;
        xd_00 = local_48;
        scan_row_mbmi((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                      (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                      (int)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                      (MV_REFERENCE_FRAME *)
                      CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                      (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                      (CANDIDATE_MV *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                      (uint16_t *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                      in_stack_fffffffffffffe78,
                      (uint8_t *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                      in_stack_fffffffffffffe88,
                      (int_mv *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                      in_stack_fffffffffffffe98,in_stack_fffffffffffffea0);
      }
    }
    iVar12 = local_fc;
    if (local_fc < 1) {
      iVar12 = -local_fc;
    }
    iVar10 = local_78;
    if (local_78 < 1) {
      iVar10 = -local_78;
    }
    if (iVar12 <= iVar10) {
      iVar12 = local_fc;
      if (local_fc < 1) {
        iVar12 = -local_fc;
      }
      if (local_88 < iVar12) {
        puVar4 = (uint16_t *)(local_8a + 1);
        mv = (MV *)local_ed;
        xd_00 = local_48;
        scan_col_mbmi((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                      in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                      (MV_REFERENCE_FRAME *)CONCAT44(in_stack_fffffffffffffe24,uVar2),
                      CONCAT13(uVar8,CONCAT12(uVar7,in_stack_fffffffffffffe1c)),
                      (CANDIDATE_MV *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                      (uint16_t *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                      (uint8_t *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                      (uint8_t *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                      (uint8_t *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                      (int_mv *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                      (int)in_stack_fffffffffffffe78,
                      (int *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      }
    }
  }
  local_fd = (local_8a[0] != '\0') + (local_8a[1] != '\0');
  if (local_8c == '\0') {
    if (local_fd != 0) {
      *(ushort *)(in_stack_00000028 + (long)local_39 * 2) =
           *(ushort *)(in_stack_00000028 + (long)local_39 * 2) | 1;
    }
    if (local_fd == 1) {
      *(ushort *)(in_stack_00000028 + (long)local_39 * 2) =
           *(ushort *)(in_stack_00000028 + (long)local_39 * 2) | 0x10;
    }
    else if (1 < local_fd) {
      *(ushort *)(in_stack_00000028 + (long)local_39 * 2) =
           *(ushort *)(in_stack_00000028 + (long)local_39 * 2) | 0x20;
    }
  }
  else if (local_8c == '\x01') {
    uVar3 = 3;
    if (local_8b != '\0') {
      uVar3 = 2;
    }
    *(ushort *)(in_stack_00000028 + (long)local_39 * 2) =
         *(ushort *)(in_stack_00000028 + (long)local_39 * 2) | uVar3;
    if (local_fd == 1) {
      *(ushort *)(in_stack_00000028 + (long)local_39 * 2) =
           *(ushort *)(in_stack_00000028 + (long)local_39 * 2) | 0x30;
    }
    else if (1 < local_fd) {
      *(ushort *)(in_stack_00000028 + (long)local_39 * 2) =
           *(ushort *)(in_stack_00000028 + (long)local_39 * 2) | 0x40;
    }
  }
  else {
    if (local_8b == '\0') {
      *(ushort *)(in_stack_00000028 + (long)local_39 * 2) =
           *(ushort *)(in_stack_00000028 + (long)local_39 * 2) | 5;
    }
    else {
      *(ushort *)(in_stack_00000028 + (long)local_39 * 2) =
           *(ushort *)(in_stack_00000028 + (long)local_39 * 2) | 4;
    }
    *(ushort *)(in_stack_00000028 + (long)local_39 * 2) =
         *(ushort *)(in_stack_00000028 + (long)local_39 * 2) | 0x50;
  }
  local_104 = (uint)local_8d;
  while (0 < (int)local_104) {
    local_108 = 0;
    for (local_10c = 1; (int)local_10c < (int)local_104; local_10c = local_10c + 1) {
      if (local_58[(int)(local_10c - 1)] < local_58[(int)local_10c]) {
        local_114 = *(undefined8 *)
                     ((long)(local_50->plane[0].pre + -2) + (long)(int)(local_10c - 1) * 8);
        local_116 = local_58[(int)(local_10c - 1)];
        *(undefined8 *)((long)(local_50->plane[0].pre + -2) + (long)(int)(local_10c - 1) * 8) =
             *(undefined8 *)((long)(local_50->plane[0].pre + -2) + (long)(int)local_10c * 8);
        *(undefined8 *)((long)(local_50->plane[0].pre + -2) + (long)(int)local_10c * 8) = local_114;
        local_58[(int)(local_10c - 1)] = local_58[(int)local_10c];
        local_58[(int)local_10c] = local_116;
        local_108 = local_10c;
      }
    }
    local_104 = local_108;
  }
  local_104 = (uint)(byte)local_48->mi_row;
  while ((int)(uint)local_8d < (int)local_104) {
    local_11c = (uint)local_8d;
    local_120 = (uint)local_8d;
    while (uVar2 = local_120, local_120 = uVar2 + 1, (int)local_120 < (int)local_104) {
      if (local_58[(int)uVar2] < local_58[(int)local_120]) {
        local_128 = *(undefined8 *)((long)(local_50->plane[0].pre + -2) + (long)(int)uVar2 * 8);
        local_12a = local_58[(int)uVar2];
        *(undefined8 *)((long)(local_50->plane[0].pre + -2) + (long)(int)uVar2 * 8) =
             *(undefined8 *)((long)(local_50->plane[0].pre + -2) + (long)(int)local_120 * 8);
        *(undefined8 *)((long)(local_50->plane[0].pre + -2) + (long)(int)local_120 * 8) = local_128;
        local_58[(int)uVar2] = local_58[(int)local_120];
        local_58[(int)local_120] = local_12a;
        local_11c = local_120;
      }
    }
    local_104 = local_11c;
  }
  if (local_38->width < 0x11) {
    local_130 = (uint)local_38->width;
  }
  else {
    local_130 = 0x10;
  }
  if ((int)((local_30->mi_params).mi_cols - in_stack_00000020) <= (int)local_130) {
    local_130 = (local_30->mi_params).mi_cols - in_stack_00000020;
  }
  if (local_38->height < 0x11) {
    local_134 = (uint)local_38->height;
  }
  else {
    local_134 = 0x10;
  }
  if ((int)((local_30->mi_params).mi_rows - in_stack_00000018) <= (int)local_134) {
    local_134 = (local_30->mi_params).mi_rows - in_stack_00000018;
  }
  local_138 = local_134;
  if ((int)local_130 < (int)local_134) {
    local_138 = local_130;
  }
  if (local_61 < '\0') {
    iVar12 = 0;
    while( true ) {
      iVar10 = local_74;
      if (local_74 < 1) {
        iVar10 = -local_74;
      }
      bVar5 = false;
      if ((0 < iVar10) && (bVar5 = false, iVar12 < (int)local_138)) {
        bVar5 = (byte)local_48->mi_row < 2;
      }
      if (!bVar5) break;
      pMVar9 = local_38->mi[iVar12 - local_38->mi_stride];
      process_single_ref_mv_candidate
                (pMVar9,local_30,local_39,(uint8_t *)local_48,(CANDIDATE_MV *)local_50,local_58);
      iVar12 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [pMVar9->bsize] + iVar12;
    }
    iVar12 = 0;
    while( true ) {
      iVar10 = local_78;
      if (local_78 < 1) {
        iVar10 = -local_78;
      }
      bVar5 = false;
      if ((0 < iVar10) && (bVar5 = false, iVar12 < (int)local_138)) {
        bVar5 = (byte)local_48->mi_row < 2;
      }
      if (!bVar5) break;
      pMVar9 = local_38->mi[iVar12 * local_38->mi_stride + -1];
      process_single_ref_mv_candidate
                (pMVar9,local_30,local_39,(uint8_t *)local_48,(CANDIDATE_MV *)local_50,local_58);
      iVar12 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [pMVar9->bsize] + iVar12;
    }
    for (iVar12 = 0; iVar12 < (int)(uint)(byte)local_48->mi_row; iVar12 = iVar12 + 1) {
      clamp_mv_ref(mv,(int)((ulong)puVar4 >> 0x20),(int)puVar4,xd_00);
    }
    if (in_stack_00000008 != 0) {
      for (uVar2 = (uint)(byte)local_48->mi_row; (int)uVar2 < 2; uVar2 = uVar2 + 1) {
        *(undefined4 *)(in_stack_00000008 + (long)(int)uVar2 * 4) = *in_stack_00000010;
      }
      iVar12 = 0;
      while( true ) {
        if ((byte)local_48->mi_row < 3) {
          local_220 = (uint)(byte)local_48->mi_row;
        }
        else {
          local_220 = 2;
        }
        if ((int)local_220 <= iVar12) break;
        *(undefined4 *)(in_stack_00000008 + (long)iVar12 * 4) =
             *(undefined4 *)((long)(local_50->plane[0].pre + -2) + (long)iVar12 * 8);
        iVar12 = iVar12 + 1;
      }
    }
  }
  else {
    if ((byte)local_48->mi_row < 2) {
      memset(&stack0xfffffffffffffea0,0,8);
      memset(&stack0xfffffffffffffe98,0,8);
      iVar12 = 0;
      while( true ) {
        iVar10 = local_74;
        if (local_74 < 1) {
          iVar10 = -local_74;
        }
        if (iVar10 < 1 || (int)local_138 <= iVar12) break;
        pMVar9 = local_38->mi[iVar12 - local_38->mi_stride];
        process_compound_ref_mv_candidate
                  (pMVar9,local_30,&local_62,(int_mv (*) [2])local_148,
                   (int *)&stack0xfffffffffffffea0,(int_mv (*) [2])local_158,
                   (int *)&stack0xfffffffffffffe98);
        iVar12 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                       [pMVar9->bsize] + iVar12;
      }
      iVar12 = 0;
      while( true ) {
        iVar10 = local_78;
        if (local_78 < 1) {
          iVar10 = -local_78;
        }
        if (iVar10 < 1 || (int)local_138 <= iVar12) break;
        pMVar9 = local_38->mi[iVar12 * local_38->mi_stride + -1];
        process_compound_ref_mv_candidate
                  (pMVar9,local_30,&local_62,(int_mv (*) [2])local_148,
                   (int *)&stack0xfffffffffffffea0,(int_mv (*) [2])local_158,
                   (int *)&stack0xfffffffffffffe98);
        iVar12 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                       [pMVar9->bsize] + iVar12;
      }
      for (iVar12 = 0; iVar12 < 2; iVar12 = iVar12 + 1) {
        iVar11 = 0;
        for (iVar10 = 0; iVar10 < (int)local_148[(long)iVar12 + -6].as_int && iVar11 < 2;
            iVar10 = iVar10 + 1) {
          *(int_mv *)(&stack0xfffffffffffffe68 + (long)iVar12 * 4 + (long)iVar11 * 8) =
               local_148[(long)iVar12 * 2 + (long)iVar10];
          iVar11 = iVar11 + 1;
        }
        for (iVar10 = 0; iVar10 < (int)local_148[(long)iVar12 + -8].as_int && iVar11 < 2;
            iVar10 = iVar10 + 1) {
          *(int_mv *)(&stack0xfffffffffffffe68 + (long)iVar12 * 4 + (long)iVar11 * 8) =
               local_158[(long)iVar12 * 2 + (long)iVar10];
          iVar11 = iVar11 + 1;
        }
        for (; iVar11 < 2; iVar11 = iVar11 + 1) {
          *(undefined4 *)(&stack0xfffffffffffffe68 + (long)iVar12 * 4 + (long)iVar11 * 8) =
               in_stack_00000010[iVar12];
        }
      }
      if ((char)local_48->mi_row == '\0') {
        for (iVar12 = 0; iVar12 < 2; iVar12 = iVar12 + 1) {
          *(undefined4 *)((long)(local_50->plane[0].pre + -2) + (ulong)(byte)local_48->mi_row * 8) =
               *(undefined4 *)(&stack0xfffffffffffffe68 + (long)iVar12 * 8);
          *(undefined4 *)((long)local_50->plane[0].pre + (ulong)(byte)local_48->mi_row * 8 + -0x3c)
               = *(undefined4 *)(&stack0xfffffffffffffe6c + (long)iVar12 * 8);
          local_58[(byte)local_48->mi_row] = 2;
          *(char *)&local_48->mi_row = (char)local_48->mi_row + '\x01';
        }
      }
      else {
        if ((in_stack_fffffffffffffe68 == local_50->mi_row) &&
           (in_stack_fffffffffffffe6c == local_50->mi_col)) {
          *(undefined4 *)((long)(local_50->plane[0].pre + -2) + (ulong)(byte)local_48->mi_row * 8) =
               in_stack_fffffffffffffe70;
          *(undefined4 *)((long)local_50->plane[0].pre + (ulong)(byte)local_48->mi_row * 8 + -0x3c)
               = in_stack_fffffffffffffe74;
        }
        else {
          *(int *)((long)(local_50->plane[0].pre + -2) + (ulong)(byte)local_48->mi_row * 8) =
               in_stack_fffffffffffffe68;
          *(int *)((long)local_50->plane[0].pre + (ulong)(byte)local_48->mi_row * 8 + -0x3c) =
               in_stack_fffffffffffffe6c;
        }
        local_58[(byte)local_48->mi_row] = 2;
        *(char *)&local_48->mi_row = (char)local_48->mi_row + '\x01';
      }
    }
    for (iVar12 = 0; iVar12 < (int)(uint)(byte)local_48->mi_row; iVar12 = iVar12 + 1) {
      clamp_mv_ref(mv,(int)((ulong)puVar4 >> 0x20),(int)puVar4,xd_00);
      clamp_mv_ref(mv,(int)((ulong)puVar4 >> 0x20),(int)puVar4,xd_00);
    }
  }
  return;
}

Assistant:

static inline void setup_ref_mv_list(
    const AV1_COMMON *cm, const MACROBLOCKD *xd, MV_REFERENCE_FRAME ref_frame,
    uint8_t *const refmv_count,
    CANDIDATE_MV ref_mv_stack[MAX_REF_MV_STACK_SIZE],
    uint16_t ref_mv_weight[MAX_REF_MV_STACK_SIZE],
    int_mv mv_ref_list[MAX_MV_REF_CANDIDATES], int_mv *gm_mv_candidates,
    int mi_row, int mi_col, int16_t *mode_context) {
  const int bs = AOMMAX(xd->width, xd->height);
  const int has_tr = has_top_right(cm, xd, mi_row, mi_col, bs);
  MV_REFERENCE_FRAME rf[2];

  const TileInfo *const tile = &xd->tile;
  int max_row_offset = 0, max_col_offset = 0;
  const int row_adj = (xd->height < mi_size_high[BLOCK_8X8]) && (mi_row & 0x01);
  const int col_adj = (xd->width < mi_size_wide[BLOCK_8X8]) && (mi_col & 0x01);
  int processed_rows = 0;
  int processed_cols = 0;

  av1_set_ref_frame(rf, ref_frame);
  mode_context[ref_frame] = 0;
  *refmv_count = 0;

  // Find valid maximum row/col offset.
  if (xd->up_available) {
    max_row_offset = -(MVREF_ROW_COLS << 1) + row_adj;

    if (xd->height < mi_size_high[BLOCK_8X8])
      max_row_offset = -(2 << 1) + row_adj;

    max_row_offset = find_valid_row_offset(tile, mi_row, max_row_offset);
  }

  if (xd->left_available) {
    max_col_offset = -(MVREF_ROW_COLS << 1) + col_adj;

    if (xd->width < mi_size_wide[BLOCK_8X8])
      max_col_offset = -(2 << 1) + col_adj;

    max_col_offset = find_valid_col_offset(tile, mi_col, max_col_offset);
  }

  uint8_t col_match_count = 0;
  uint8_t row_match_count = 0;
  uint8_t newmv_count = 0;

  // Scan the first above row mode info. row_offset = -1;
  if (abs(max_row_offset) >= 1)
    scan_row_mbmi(cm, xd, mi_col, rf, -1, ref_mv_stack, ref_mv_weight,
                  refmv_count, &row_match_count, &newmv_count, gm_mv_candidates,
                  max_row_offset, &processed_rows);
  // Scan the first left column mode info. col_offset = -1;
  if (abs(max_col_offset) >= 1)
    scan_col_mbmi(cm, xd, mi_row, rf, -1, ref_mv_stack, ref_mv_weight,
                  refmv_count, &col_match_count, &newmv_count, gm_mv_candidates,
                  max_col_offset, &processed_cols);
  // Check top-right boundary
  if (has_tr)
    scan_blk_mbmi(cm, xd, mi_row, mi_col, rf, -1, xd->width, ref_mv_stack,
                  ref_mv_weight, &row_match_count, &newmv_count,
                  gm_mv_candidates, refmv_count);

  const uint8_t nearest_match = (row_match_count > 0) + (col_match_count > 0);
  const uint8_t nearest_refmv_count = *refmv_count;

  // TODO(yunqing): for comp_search, do it for all 3 cases.
  for (int idx = 0; idx < nearest_refmv_count; ++idx)
    ref_mv_weight[idx] += REF_CAT_LEVEL;

  if (cm->features.allow_ref_frame_mvs) {
    int is_available = 0;
    const int voffset = AOMMAX(mi_size_high[BLOCK_8X8], xd->height);
    const int hoffset = AOMMAX(mi_size_wide[BLOCK_8X8], xd->width);
    const int blk_row_end = AOMMIN(xd->height, mi_size_high[BLOCK_64X64]);
    const int blk_col_end = AOMMIN(xd->width, mi_size_wide[BLOCK_64X64]);

    const int tpl_sample_pos[3][2] = {
      { voffset, -2 },
      { voffset, hoffset },
      { voffset - 2, hoffset },
    };
    const int allow_extension = (xd->height >= mi_size_high[BLOCK_8X8]) &&
                                (xd->height < mi_size_high[BLOCK_64X64]) &&
                                (xd->width >= mi_size_wide[BLOCK_8X8]) &&
                                (xd->width < mi_size_wide[BLOCK_64X64]);

    const int step_h = (xd->height >= mi_size_high[BLOCK_64X64])
                           ? mi_size_high[BLOCK_16X16]
                           : mi_size_high[BLOCK_8X8];
    const int step_w = (xd->width >= mi_size_wide[BLOCK_64X64])
                           ? mi_size_wide[BLOCK_16X16]
                           : mi_size_wide[BLOCK_8X8];

    for (int blk_row = 0; blk_row < blk_row_end; blk_row += step_h) {
      for (int blk_col = 0; blk_col < blk_col_end; blk_col += step_w) {
        int ret = add_tpl_ref_mv(cm, xd, mi_row, mi_col, ref_frame, blk_row,
                                 blk_col, gm_mv_candidates, refmv_count,
                                 ref_mv_stack, ref_mv_weight, mode_context);
        if (blk_row == 0 && blk_col == 0) is_available = ret;
      }
    }

    if (is_available == 0) mode_context[ref_frame] |= (1 << GLOBALMV_OFFSET);

    for (int i = 0; i < 3 && allow_extension; ++i) {
      const int blk_row = tpl_sample_pos[i][0];
      const int blk_col = tpl_sample_pos[i][1];

      if (!check_sb_border(mi_row, mi_col, blk_row, blk_col)) continue;
      add_tpl_ref_mv(cm, xd, mi_row, mi_col, ref_frame, blk_row, blk_col,
                     gm_mv_candidates, refmv_count, ref_mv_stack, ref_mv_weight,
                     mode_context);
    }
  }

  uint8_t dummy_newmv_count = 0;

  // Scan the second outer area.
  scan_blk_mbmi(cm, xd, mi_row, mi_col, rf, -1, -1, ref_mv_stack, ref_mv_weight,
                &row_match_count, &dummy_newmv_count, gm_mv_candidates,
                refmv_count);

  for (int idx = 2; idx <= MVREF_ROW_COLS; ++idx) {
    const int row_offset = -(idx << 1) + 1 + row_adj;
    const int col_offset = -(idx << 1) + 1 + col_adj;

    if (abs(row_offset) <= abs(max_row_offset) &&
        abs(row_offset) > processed_rows)
      scan_row_mbmi(cm, xd, mi_col, rf, row_offset, ref_mv_stack, ref_mv_weight,
                    refmv_count, &row_match_count, &dummy_newmv_count,
                    gm_mv_candidates, max_row_offset, &processed_rows);

    if (abs(col_offset) <= abs(max_col_offset) &&
        abs(col_offset) > processed_cols)
      scan_col_mbmi(cm, xd, mi_row, rf, col_offset, ref_mv_stack, ref_mv_weight,
                    refmv_count, &col_match_count, &dummy_newmv_count,
                    gm_mv_candidates, max_col_offset, &processed_cols);
  }

  const uint8_t ref_match_count = (row_match_count > 0) + (col_match_count > 0);

  switch (nearest_match) {
    case 0:
      if (ref_match_count >= 1) mode_context[ref_frame] |= 1;
      if (ref_match_count == 1)
        mode_context[ref_frame] |= (1 << REFMV_OFFSET);
      else if (ref_match_count >= 2)
        mode_context[ref_frame] |= (2 << REFMV_OFFSET);
      break;
    case 1:
      mode_context[ref_frame] |= (newmv_count > 0) ? 2 : 3;
      if (ref_match_count == 1)
        mode_context[ref_frame] |= (3 << REFMV_OFFSET);
      else if (ref_match_count >= 2)
        mode_context[ref_frame] |= (4 << REFMV_OFFSET);
      break;
    case 2:
    default:
      if (newmv_count >= 1)
        mode_context[ref_frame] |= 4;
      else
        mode_context[ref_frame] |= 5;

      mode_context[ref_frame] |= (5 << REFMV_OFFSET);
      break;
  }

  // Rank the likelihood and assign nearest and near mvs.
  int len = nearest_refmv_count;
  while (len > 0) {
    int nr_len = 0;
    for (int idx = 1; idx < len; ++idx) {
      if (ref_mv_weight[idx - 1] < ref_mv_weight[idx]) {
        const CANDIDATE_MV tmp_mv = ref_mv_stack[idx - 1];
        const uint16_t tmp_ref_mv_weight = ref_mv_weight[idx - 1];
        ref_mv_stack[idx - 1] = ref_mv_stack[idx];
        ref_mv_stack[idx] = tmp_mv;
        ref_mv_weight[idx - 1] = ref_mv_weight[idx];
        ref_mv_weight[idx] = tmp_ref_mv_weight;
        nr_len = idx;
      }
    }
    len = nr_len;
  }

  len = *refmv_count;
  while (len > nearest_refmv_count) {
    int nr_len = nearest_refmv_count;
    for (int idx = nearest_refmv_count + 1; idx < len; ++idx) {
      if (ref_mv_weight[idx - 1] < ref_mv_weight[idx]) {
        const CANDIDATE_MV tmp_mv = ref_mv_stack[idx - 1];
        const uint16_t tmp_ref_mv_weight = ref_mv_weight[idx - 1];
        ref_mv_stack[idx - 1] = ref_mv_stack[idx];
        ref_mv_stack[idx] = tmp_mv;
        ref_mv_weight[idx - 1] = ref_mv_weight[idx];
        ref_mv_weight[idx] = tmp_ref_mv_weight;
        nr_len = idx;
      }
    }
    len = nr_len;
  }

  int mi_width = AOMMIN(mi_size_wide[BLOCK_64X64], xd->width);
  mi_width = AOMMIN(mi_width, cm->mi_params.mi_cols - mi_col);
  int mi_height = AOMMIN(mi_size_high[BLOCK_64X64], xd->height);
  mi_height = AOMMIN(mi_height, cm->mi_params.mi_rows - mi_row);
  const int mi_size = AOMMIN(mi_width, mi_height);
  if (rf[1] > NONE_FRAME) {
    // TODO(jingning, yunqing): Refactor and consolidate the compound and
    // single reference frame modes. Reduce unnecessary redundancy.
    if (*refmv_count < MAX_MV_REF_CANDIDATES) {
      int_mv ref_id[2][2], ref_diff[2][2];
      int ref_id_count[2] = { 0 }, ref_diff_count[2] = { 0 };

      for (int idx = 0; abs(max_row_offset) >= 1 && idx < mi_size;) {
        const MB_MODE_INFO *const candidate = xd->mi[-xd->mi_stride + idx];
        process_compound_ref_mv_candidate(
            candidate, cm, rf, ref_id, ref_id_count, ref_diff, ref_diff_count);
        idx += mi_size_wide[candidate->bsize];
      }

      for (int idx = 0; abs(max_col_offset) >= 1 && idx < mi_size;) {
        const MB_MODE_INFO *const candidate = xd->mi[idx * xd->mi_stride - 1];
        process_compound_ref_mv_candidate(
            candidate, cm, rf, ref_id, ref_id_count, ref_diff, ref_diff_count);
        idx += mi_size_high[candidate->bsize];
      }

      // Build up the compound mv predictor
      int_mv comp_list[MAX_MV_REF_CANDIDATES][2];

      for (int idx = 0; idx < 2; ++idx) {
        int comp_idx = 0;
        for (int list_idx = 0;
             list_idx < ref_id_count[idx] && comp_idx < MAX_MV_REF_CANDIDATES;
             ++list_idx, ++comp_idx)
          comp_list[comp_idx][idx] = ref_id[idx][list_idx];
        for (int list_idx = 0;
             list_idx < ref_diff_count[idx] && comp_idx < MAX_MV_REF_CANDIDATES;
             ++list_idx, ++comp_idx)
          comp_list[comp_idx][idx] = ref_diff[idx][list_idx];
        for (; comp_idx < MAX_MV_REF_CANDIDATES; ++comp_idx)
          comp_list[comp_idx][idx] = gm_mv_candidates[idx];
      }

      if (*refmv_count) {
        assert(*refmv_count == 1);
        if (comp_list[0][0].as_int == ref_mv_stack[0].this_mv.as_int &&
            comp_list[0][1].as_int == ref_mv_stack[0].comp_mv.as_int) {
          ref_mv_stack[*refmv_count].this_mv = comp_list[1][0];
          ref_mv_stack[*refmv_count].comp_mv = comp_list[1][1];
        } else {
          ref_mv_stack[*refmv_count].this_mv = comp_list[0][0];
          ref_mv_stack[*refmv_count].comp_mv = comp_list[0][1];
        }
        ref_mv_weight[*refmv_count] = 2;
        ++*refmv_count;
      } else {
        for (int idx = 0; idx < MAX_MV_REF_CANDIDATES; ++idx) {
          ref_mv_stack[*refmv_count].this_mv = comp_list[idx][0];
          ref_mv_stack[*refmv_count].comp_mv = comp_list[idx][1];
          ref_mv_weight[*refmv_count] = 2;
          ++*refmv_count;
        }
      }
    }

    assert(*refmv_count >= 2);

    for (int idx = 0; idx < *refmv_count; ++idx) {
      clamp_mv_ref(&ref_mv_stack[idx].this_mv.as_mv, xd->width << MI_SIZE_LOG2,
                   xd->height << MI_SIZE_LOG2, xd);
      clamp_mv_ref(&ref_mv_stack[idx].comp_mv.as_mv, xd->width << MI_SIZE_LOG2,
                   xd->height << MI_SIZE_LOG2, xd);
    }
  } else {
    // Handle single reference frame extension
    for (int idx = 0; abs(max_row_offset) >= 1 && idx < mi_size &&
                      *refmv_count < MAX_MV_REF_CANDIDATES;) {
      const MB_MODE_INFO *const candidate = xd->mi[-xd->mi_stride + idx];
      process_single_ref_mv_candidate(candidate, cm, ref_frame, refmv_count,
                                      ref_mv_stack, ref_mv_weight);
      idx += mi_size_wide[candidate->bsize];
    }

    for (int idx = 0; abs(max_col_offset) >= 1 && idx < mi_size &&
                      *refmv_count < MAX_MV_REF_CANDIDATES;) {
      const MB_MODE_INFO *const candidate = xd->mi[idx * xd->mi_stride - 1];
      process_single_ref_mv_candidate(candidate, cm, ref_frame, refmv_count,
                                      ref_mv_stack, ref_mv_weight);
      idx += mi_size_high[candidate->bsize];
    }

    for (int idx = 0; idx < *refmv_count; ++idx) {
      clamp_mv_ref(&ref_mv_stack[idx].this_mv.as_mv, xd->width << MI_SIZE_LOG2,
                   xd->height << MI_SIZE_LOG2, xd);
    }

    if (mv_ref_list != NULL) {
      for (int idx = *refmv_count; idx < MAX_MV_REF_CANDIDATES; ++idx)
        mv_ref_list[idx].as_int = gm_mv_candidates[0].as_int;

      for (int idx = 0; idx < AOMMIN(MAX_MV_REF_CANDIDATES, *refmv_count);
           ++idx) {
        mv_ref_list[idx].as_int = ref_mv_stack[idx].this_mv.as_int;
      }
    }
  }
}